

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

bool __thiscall Rml::DataParser::Match(DataParser *this,char c,bool skip_whitespace)

{
  char cVar1;
  
  if (this->reached_end == false) {
    cVar1 = (this->expression)._M_dataplus._M_p[this->index];
  }
  else {
    cVar1 = '\0';
  }
  if (cVar1 == c) {
    Next(this);
    if (skip_whitespace) {
      SkipWhitespace(this);
    }
  }
  else {
    Expected(this,c);
  }
  return cVar1 == c;
}

Assistant:

bool Match(char c, bool skip_whitespace = true)
	{
		if (c == Look())
		{
			Next();
			if (skip_whitespace)
				SkipWhitespace();
			return true;
		}
		Expected(c);
		return false;
	}